

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChArchive.h
# Opt level: O0

void __thiscall
chrono::
ChValueSpecific<Eigen::Ref<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>_>::
ChValueSpecific(ChValueSpecific<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                *this,Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_> *mvalp,
               char *mname,char flags)

{
  char flags_local;
  char *mname_local;
  Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_> *mvalp_local;
  ChValueSpecific<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
  *this_local;
  
  ChValue::ChValue(&this->super_ChValue);
  (this->super_ChValue)._vptr_ChValue = (_func_int **)&PTR__ChValueSpecific_00236910;
  this->_ptr_to_val = mvalp;
  std::__cxx11::string::operator=((string *)&(this->super_ChValue)._name,mname);
  (this->super_ChValue)._flags = flags;
  return;
}

Assistant:

ChValueSpecific(TClass& mvalp, const char* mname, char flags) { 
          _ptr_to_val = (TClass*)(& mvalp);
          _name = mname;
          _flags = flags;
      }